

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-create-socket-early.c
# Opt level: O3

int run_test_udp_create_early_bad_domain(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_udp_t client;
  uv_udp_t local_e0;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_udp_init_ex(puVar2,&local_e0,0x2f);
  if (iVar1 == -0x16) {
    puVar2 = uv_default_loop();
    iVar1 = uv_udp_init_ex(puVar2,&local_e0,0x400);
    if (iVar1 == -0x16) {
      puVar2 = uv_default_loop();
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00184f28;
    }
  }
  else {
    run_test_udp_create_early_bad_domain_cold_1();
  }
  run_test_udp_create_early_bad_domain_cold_2();
LAB_00184f28:
  run_test_udp_create_early_bad_domain_cold_3();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(udp_create_early_bad_domain) {
  uv_udp_t client;
  int r;

  r = uv_udp_init_ex(uv_default_loop(), &client, 47);
  ASSERT(r == UV_EINVAL);

  r = uv_udp_init_ex(uv_default_loop(), &client, 1024);
  ASSERT(r == UV_EINVAL);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}